

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void google::protobuf::DynamicMessageFactory::ConstructDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_or_weak_instance)

{
  FieldDescriptor *this;
  Type TVar1;
  undefined4 uVar2;
  long lVar3;
  long *plVar4;
  EnumValueDescriptor *pEVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if (0 < *(int *)(type + 0x38)) {
    lVar7 = 0;
    do {
      lVar3 = *(long *)(type + 0x40);
      lVar9 = lVar7 * 0x30;
      if (0 < *(int *)(lVar3 + 0x1c + lVar9)) {
        lVar10 = 0;
        do {
          this = *(FieldDescriptor **)(*(long *)(lVar3 + 0x20 + lVar9) + lVar10 * 8);
          if (this[0x50] == (FieldDescriptor)0x0) {
            plVar4 = (long *)(*(long *)(this + 0x58) + 0x30);
          }
          else if (*(long *)(this + 0x68) == 0) {
            plVar4 = (long *)(*(long *)(this + 0x30) + 0x98);
          }
          else {
            plVar4 = (long *)(*(long *)(this + 0x68) + 0x80);
          }
          uVar8 = (ulong)offsets[(int)((ulong)((long)this - *plVar4) >> 3) * 0x3cf3cf3d];
          TVar1 = FieldDescriptor::type(this);
          switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4)) {
          case 1:
          case 3:
            uVar2 = *(undefined4 *)(this + 0xa0);
            goto LAB_00312cc9;
          case 2:
          case 4:
            uVar6 = *(undefined8 *)(this + 0xa0);
            goto LAB_00312d10;
          case 5:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar8) =
                 *(undefined8 *)(this + 0xa0);
            break;
          case 6:
            *(undefined4 *)((long)default_oneof_or_weak_instance + uVar8) =
                 *(undefined4 *)(this + 0xa0);
            break;
          case 7:
            *(FieldDescriptor *)((long)default_oneof_or_weak_instance + uVar8) = this[0xa0];
            break;
          case 8:
            pEVar5 = FieldDescriptor::default_value_enum(this);
            uVar2 = *(undefined4 *)(pEVar5 + 0x10);
LAB_00312cc9:
            *(undefined4 *)((long)default_oneof_or_weak_instance + uVar8) = uVar2;
            break;
          case 9:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar8) = 0;
            uVar6 = *(undefined8 *)(this + 0xa0);
LAB_00312d10:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar8) = uVar6;
            break;
          case 10:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar8) = 0;
          }
          lVar10 = lVar10 + 1;
          lVar3 = *(long *)(type + 0x40);
        } while (lVar10 < *(int *)(lVar3 + 0x1c + lVar9));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(type + 0x38));
  }
  return;
}

Assistant:

void DynamicMessageFactory::ConstructDefaultOneofInstance(
    const Descriptor* type,
    const uint32 offsets[],
    void* default_oneof_or_weak_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      void* field_ptr = reinterpret_cast<uint8*>(
          default_oneof_or_weak_instance) + offsets[field->index()];
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                      \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                        \
          new(field_ptr) TYPE(field->default_value_##TYPE());           \
          break;

        HANDLE_TYPE(INT32 , int32 );
        HANDLE_TYPE(INT64 , int64 );
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT , float );
        HANDLE_TYPE(BOOL  , bool  );
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          new(field_ptr) int(field->default_value_enum()->number());
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING:
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(&field->default_value_string());
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE: {
          new(field_ptr) Message*(NULL);
          break;
        }
      }
    }
  }
}